

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

Sphere * pbrt::Sphere::Create
                   (Transform *renderFromObject,Transform *objectFromRender,bool reverseOrientation,
                   ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined4 extraout_var;
  undefined1 auVar4 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  string local_78;
  Float local_54;
  Float local_50;
  Float local_4c;
  Float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"radius","");
  local_48 = ParameterDictionary::GetOneFloat(parameters,&local_78,1.0);
  uStack_44 = extraout_XMM0_Db;
  uStack_40 = extraout_XMM0_Dc;
  uStack_3c = extraout_XMM0_Dd;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"zmin","");
  auVar2._4_4_ = uStack_44;
  auVar2._0_4_ = local_48;
  auVar2._8_4_ = uStack_40;
  auVar2._12_4_ = uStack_3c;
  auVar4._8_4_ = 0x80000000;
  auVar4._0_8_ = 0x8000000080000000;
  auVar4._12_4_ = 0x80000000;
  auVar4 = vxorps_avx512vl(auVar2,auVar4);
  local_4c = ParameterDictionary::GetOneFloat(parameters,&local_78,auVar4._0_4_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"zmax","");
  local_50 = ParameterDictionary::GetOneFloat(parameters,&local_78,local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"phimax","");
  local_54 = ParameterDictionary::GetOneFloat(parameters,&local_78,360.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x30,8);
  Sphere((Sphere *)CONCAT44(extraout_var,iVar3),renderFromObject,objectFromRender,reverseOrientation
         ,local_48,local_4c,local_50,local_54);
  return (Sphere *)CONCAT44(extraout_var,iVar3);
}

Assistant:

Sphere *Sphere::Create(const Transform *renderFromObject,
                       const Transform *objectFromRender, bool reverseOrientation,
                       const ParameterDictionary &parameters, const FileLoc *loc,
                       Allocator alloc) {
    Float radius = parameters.GetOneFloat("radius", 1.f);
    Float zmin = parameters.GetOneFloat("zmin", -radius);
    Float zmax = parameters.GetOneFloat("zmax", radius);
    Float phimax = parameters.GetOneFloat("phimax", 360.f);
    return alloc.new_object<Sphere>(renderFromObject, objectFromRender,
                                    reverseOrientation, radius, zmin, zmax, phimax);
}